

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

void __thiscall APowerFlight::InitEffect(APowerFlight *this)

{
  AActor *pAVar1;
  double dVar2;
  APowerFlight *this_local;
  
  APowerup::InitEffect(&this->super_APowerup);
  pAVar1 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
  TFlags<ActorFlag2,_unsigned_int>::operator|=(&pAVar1->flags2,MF2_FLY);
  pAVar1 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
  TFlags<ActorFlag,_unsigned_int>::operator|=(&pAVar1->flags,MF_NOGRAVITY);
  pAVar1 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
  dVar2 = AActor::Z(pAVar1);
  pAVar1 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
  if (dVar2 <= pAVar1->floorz) {
    pAVar1 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    (pAVar1->Vel).Z = 4.0;
  }
  pAVar1 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
  if ((pAVar1->Vel).Z <= -35.0) {
    pAVar1 = ::TObjPtr::operator_cast_to_AActor_
                       ((TObjPtr *)&(this->super_APowerup).super_AInventory.Owner);
    S_StopSound(pAVar1,2);
  }
  return;
}

Assistant:

void APowerFlight::InitEffect ()
{
	Super::InitEffect();
	Owner->flags2 |= MF2_FLY;
	Owner->flags |= MF_NOGRAVITY;
	if (Owner->Z() <= Owner->floorz)
	{
		Owner->Vel.Z = 4;;	// thrust the player in the air a bit
	}
	if (Owner->Vel.Z <= -35)
	{ // stop falling scream
		S_StopSound (Owner, CHAN_VOICE);
	}
}